

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagegenerator.cpp
# Opt level: O0

void __thiscall
stackjit::AssemblyImageGenerator::generateClassBody
          (AssemblyImageGenerator *this,BinaryData *data,Class *classDef)

{
  bool bVar1;
  string *psVar2;
  AttributeContainer *pAVar3;
  vector<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_> *pvVar4;
  size_type value;
  reference this_00;
  Field *field;
  iterator __end1;
  iterator __begin1;
  vector<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_> *__range1;
  Class *classDef_local;
  BinaryData *data_local;
  AssemblyImageGenerator *this_local;
  
  psVar2 = Loader::Class::parentClassName_abi_cxx11_(classDef);
  anon_unknown_3::addString(data,psVar2);
  pAVar3 = Loader::Class::attributes_abi_cxx11_(classDef);
  generateAttributes(this,data,pAVar3);
  pvVar4 = Loader::Class::fields(classDef);
  value = std::vector<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>::size
                    (pvVar4);
  anon_unknown_3::addData<unsigned_long>(data,value);
  pvVar4 = Loader::Class::fields(classDef);
  __end1 = std::vector<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>::begin
                     (pvVar4);
  field = (Field *)std::vector<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>::
                   end(pvVar4);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<stackjit::Loader::Field_*,_std::vector<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>_>
                                *)&field);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<stackjit::Loader::Field_*,_std::vector<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>_>
              ::operator*(&__end1);
    pAVar3 = Loader::Field::attributes_abi_cxx11_(this_00);
    generateAttributes(this,data,pAVar3);
    psVar2 = Loader::Field::name_abi_cxx11_(this_00);
    anon_unknown_3::addString(data,psVar2);
    psVar2 = Loader::Field::type_abi_cxx11_(this_00);
    anon_unknown_3::addString(data,psVar2);
    __gnu_cxx::
    __normal_iterator<stackjit::Loader::Field_*,_std::vector<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void AssemblyImageGenerator::generateClassBody(BinaryData& data, Loader::Class& classDef) {
		//Inheritance
		addString(data, classDef.parentClassName());

		//Class attributes
		generateAttributes(data, classDef.attributes());

		//Fields
		addData(data, classDef.fields().size());
		for (auto& field : classDef.fields()) {
			generateAttributes(data, field.attributes());
			addString(data, field.name());
			addString(data, field.type());
		}
	}